

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O3

void reuse_on_delete_test(void)

{
  fdb_status fVar1;
  sb_decision_t sVar2;
  fdb_kvs_handle *pfVar3;
  size_t sVar4;
  char *pcVar5;
  fdb_kvs_handle *pfVar6;
  size_t sVar7;
  int iVar8;
  char *pcVar9;
  fdb_doc **doc;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  fdb_kvs_handle *pfVar13;
  ulong uVar14;
  char *pcVar15;
  fdb_kvs_handle *handle;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  timeval __test_begin;
  char bodybuf [512];
  fdb_kvs_config kvs_config;
  fdb_file_info file_info;
  char keybuf [256];
  fdb_config fconfig;
  fdb_kvs_handle *pfStackY_12b8;
  fdb_file_handle *pfStackY_12b0;
  fdb_kvs_config fStackY_12a8;
  char acStackY_1290 [264];
  fdb_config fStackY_1188;
  char acStackY_1090 [520];
  fdb_doc **ppfStackY_e88;
  size_t sStackY_e78;
  char *pcStackY_e70;
  char *pcStackY_e68;
  code *pcStackY_e60;
  fdb_kvs_handle *pfStack_e50;
  fdb_file_handle *pfStack_e48;
  fdb_iterator *pfStack_e40;
  fdb_doc *pfStack_e38;
  fdb_kvs_handle *pfStack_e30;
  timeval tStack_e28;
  char acStack_e18 [512];
  fdb_kvs_config fStack_c18;
  fdb_file_info fStack_c00;
  char acStack_bb8 [256];
  fdb_config fStack_ab8;
  char *pcStack_9c0;
  fdb_kvs_handle *pfStack_9b8;
  fdb_kvs_handle *pfStack_9b0;
  fdb_kvs_handle *pfStack_9a8;
  fdb_kvs_handle *pfStack_9a0;
  fdb_kvs_handle *pfStack_998;
  fdb_kvs_handle *pfStack_988;
  fdb_file_handle *pfStack_980;
  uint uStack_974;
  fdb_kvs_info fStack_970;
  timeval tStack_940;
  fdb_kvs_config fStack_930;
  undefined1 auStack_918 [80];
  docio_handle *pdStack_8c8;
  btreeblk_handle *pbStack_8c0;
  btree_blk_ops *pbStack_8b8;
  filemgr_ops *pfStack_8b0;
  fdb_config fStack_8a8;
  undefined1 uStack_6d1;
  fdb_kvs_handle fStack_6d0;
  fdb_kvs_handle *pfStack_4c8;
  char *pcStack_4c0;
  char *pcStack_4b8;
  fdb_kvs_handle *pfStack_4b0;
  fdb_kvs_handle *local_4a8;
  fdb_file_handle *local_4a0;
  timeval local_498;
  undefined1 local_488 [536];
  undefined1 local_270 [375];
  undefined1 local_f9;
  fdb_kvs_handle *local_70;
  undefined8 local_58;
  
  pfStack_4b0 = (fdb_kvs_handle *)0x10daa5;
  gettimeofday(&local_498,(__timezone_ptr_t)0x0);
  pfStack_4b0 = (fdb_kvs_handle *)0x10daaa;
  memleak_start();
  pfStack_4b0 = (fdb_kvs_handle *)0x10daba;
  fdb_get_default_kvs_config();
  pfStack_4b0 = (fdb_kvs_handle *)0x10daca;
  fdb_get_default_config();
  local_f9 = 0;
  local_70 = (fdb_kvs_handle *)0x41;
  local_58 = 10;
  pfStack_4b0 = (fdb_kvs_handle *)0x10daf1;
  system("rm -rf  staleblktest* > errorlog.txt");
  pfStack_4b0 = (fdb_kvs_handle *)0x10db08;
  fdb_open(&local_4a0,"./staleblktest1",(fdb_config *)(local_270 + 0x148));
  pfStack_4b0 = (fdb_kvs_handle *)0x10db16;
  fdb_kvs_open_default(local_4a0,&local_4a8,(fdb_kvs_config *)(local_488 + 0x200));
  pcVar9 = "%dkey";
  pcVar5 = local_270 + 0x48;
  pcVar15 = local_488;
  pfVar13 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_4b0 = (fdb_kvs_handle *)0x10db3b;
    sprintf(pcVar5,"%dkey",pfVar13);
    pfStack_4b0 = (fdb_kvs_handle *)0x10db4d;
    memset(pcVar15,0x62,0x1ff);
    pfVar6 = local_4a8;
    local_488[0x1ff] = 0;
    pfStack_4b0 = (fdb_kvs_handle *)0x10db61;
    pfVar3 = (fdb_kvs_handle *)strlen(pcVar5);
    pfStack_4b0 = (fdb_kvs_handle *)0x10db6c;
    sVar4 = strlen(pcVar15);
    pfStack_4b0 = (fdb_kvs_handle *)0x10db80;
    fVar1 = fdb_set_kv(pfVar6,pcVar5,(size_t)pfVar3,pcVar15,sVar4);
    if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_0010de19:
      pfStack_4b0 = (fdb_kvs_handle *)0x10de20;
      reuse_on_delete_test();
      goto LAB_0010de20;
    }
    pfStack_4b0 = (fdb_kvs_handle *)0x10db97;
    fVar1 = fdb_commit(local_4a0,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pfStack_4b0 = (fdb_kvs_handle *)0x10de19;
      reuse_on_delete_test();
      goto LAB_0010de19;
    }
    uVar10 = (int)pfVar13 + 1;
    pfVar13 = (fdb_kvs_handle *)(ulong)uVar10;
  } while (uVar10 != 0xb);
  pcVar15 = local_270 + 0x48;
  pfVar6 = (fdb_kvs_handle *)local_488;
  pfVar3 = (fdb_kvs_handle *)local_270;
  pcVar9 = (char *)(fdb_kvs_handle *)0x0;
  do {
    handle = (fdb_kvs_handle *)pcVar9;
    pfStack_4b0 = (fdb_kvs_handle *)0x10dbd0;
    sprintf(pcVar15,"%dkey",handle);
    pfVar13 = local_4a8;
    local_488._0_8_ = 0x6363636363636363;
    local_488._8_8_ = (fdb_custom_cmp_variable)0x6363636363636363;
    local_488._16_8_ = (void *)0x6363636363636363;
    local_488._24_8_ = (kvs_info *)0x6363636363636363;
    local_488._32_8_ = (kvs_ops_stat *)0x6363636363636363;
    local_488._40_8_ = (fdb_file_handle *)0x6363636363636363;
    local_488._48_8_ = (hbtrie *)0x6363636363636363;
    local_488._56_8_ = (btree *)0x6363636363636363;
    local_488._64_8_ = (btree *)0x6363636363636363;
    local_488._72_8_ = (filemgr *)0x6363636363636363;
    local_488._80_8_ = (docio_handle *)0x6363636363636363;
    local_488._88_8_ = (btreeblk_handle *)0x6363636363636363;
    local_488._96_8_ = (btree_blk_ops *)0x6363636363636363;
    local_488._104_7_ = 0x63636363636363;
    local_488[0x6f] = 99;
    local_488._112_7_ = 0x63636363636363;
    local_488._119_8_ = 0x6363636363636363;
    local_488[0x7f] = 0;
    pfStack_4b0 = (fdb_kvs_handle *)0x10dc19;
    pcVar5 = (char *)strlen(pcVar15);
    pfStack_4b0 = (fdb_kvs_handle *)0x10dc24;
    sVar4 = strlen((char *)pfVar6);
    pfStack_4b0 = (fdb_kvs_handle *)0x10dc38;
    fVar1 = fdb_set_kv(pfVar13,pcVar15,(size_t)pcVar5,pfVar6,sVar4);
    pcVar9 = (char *)handle;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010de27;
    pfStack_4b0 = (fdb_kvs_handle *)0x10dc4d;
    fVar1 = fdb_get_file_info(local_4a0,(fdb_file_info *)pfVar3);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010de20;
    uVar10 = (uint)handle + 1;
    pcVar9 = (char *)(ulong)uVar10;
  } while ((ulong)local_270._40_8_ < (fdb_file_handle *)0x1000000);
  pfStack_4b0 = (fdb_kvs_handle *)0x10dc72;
  sVar2 = sb_check_block_reusing(local_4a8);
  if (sVar2 != SBD_NONE) goto LAB_0010de3c;
  pfStack_4b0 = (fdb_kvs_handle *)0x10dc89;
  fVar1 = fdb_commit(local_4a0,'\x01');
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010de41;
  pcVar5 = "%dkey";
  pcVar15 = local_270 + 0x48;
  pfVar13 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_4b0 = (fdb_kvs_handle *)0x10dcb5;
    sprintf(pcVar15,"%dkey",pfVar13);
    pfVar6 = local_4a8;
    pfStack_4b0 = (fdb_kvs_handle *)0x10dcc1;
    sVar4 = strlen(pcVar15);
    pfStack_4b0 = (fdb_kvs_handle *)0x10dccf;
    fVar1 = fdb_del_kv(pfVar6,pcVar15,sVar4);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010de2e;
    uVar11 = (int)pfVar13 + 1;
    pfVar13 = (fdb_kvs_handle *)(ulong)uVar11;
  } while (uVar10 != uVar11);
  pfStack_4b0 = (fdb_kvs_handle *)0x10dce6;
  sVar2 = sb_check_block_reusing(local_4a8);
  if (sVar2 != SBD_RECLAIM) goto LAB_0010de48;
  if (2 < (uint)handle) {
    pcVar9 = (char *)(ulong)(uVar10 >> 2);
    pcVar15 = local_270 + 0x48;
    pfVar6 = (fdb_kvs_handle *)local_488;
    pfVar13 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_4b0 = (fdb_kvs_handle *)0x10dd1e;
      sprintf(pcVar15,"%dkey",pfVar13);
      handle = local_4a8;
      local_488._0_8_ = 0x6464646464646464;
      local_488._8_8_ = (fdb_custom_cmp_variable)0x6464646464646464;
      local_488._16_8_ = (void *)0x6464646464646464;
      local_488._24_8_ = (kvs_info *)0x6464646464646464;
      local_488._32_8_ = (kvs_ops_stat *)0x6464646464646464;
      local_488._40_8_ = (fdb_file_handle *)0x6464646464646464;
      local_488._48_8_ = (hbtrie *)0x6464646464646464;
      local_488._56_8_ = (btree *)0x6464646464646464;
      local_488._64_8_ = (btree *)0x6464646464646464;
      local_488._72_8_ = (filemgr *)0x6464646464646464;
      local_488._80_8_ = (docio_handle *)0x6464646464646464;
      local_488._88_8_ = (btreeblk_handle *)0x6464646464646464;
      local_488._96_8_ = (btree_blk_ops *)0x6464646464646464;
      local_488._104_7_ = 0x64646464646464;
      local_488[0x6f] = 100;
      local_488._112_7_ = 0x64646464646464;
      local_488._119_8_ = 0x6464646464646464;
      local_488[0x7f] = 0;
      pfStack_4b0 = (fdb_kvs_handle *)0x10dd67;
      pcVar5 = (char *)strlen(pcVar15);
      pfStack_4b0 = (fdb_kvs_handle *)0x10dd72;
      sVar4 = strlen((char *)pfVar6);
      pfStack_4b0 = (fdb_kvs_handle *)0x10dd86;
      fVar1 = fdb_set_kv(handle,pcVar15,(size_t)pcVar5,pfVar6,sVar4);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010de35;
      uVar11 = (int)pfVar13 + 2;
      pfVar13 = (fdb_kvs_handle *)(ulong)uVar11;
    } while (uVar11 < uVar10 >> 2);
  }
  pcVar15 = local_270 + 0x48;
  pfStack_4b0 = (fdb_kvs_handle *)0x10dda2;
  sVar2 = sb_check_block_reusing(local_4a8);
  if (sVar2 != SBD_RECLAIM) goto LAB_0010de4d;
  pfStack_4b0 = (fdb_kvs_handle *)0x10ddb5;
  fVar1 = fdb_close(local_4a0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010de52;
  pfStack_4b0 = (fdb_kvs_handle *)0x10ddc2;
  fVar1 = fdb_shutdown();
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfStack_4b0 = (fdb_kvs_handle *)0x10ddcf;
    memleak_end();
    pcVar15 = "%s PASSED\n";
    if (reuse_on_delete_test()::__test_pass != '\0') {
      pcVar15 = "%s FAILED\n";
    }
    pfStack_4b0 = (fdb_kvs_handle *)0x10de00;
    fprintf(_stderr,pcVar15,"reuse on delete test");
    return;
  }
  goto LAB_0010de59;
LAB_0010de20:
  pfStack_4b0 = (fdb_kvs_handle *)0x10de27;
  reuse_on_delete_test();
LAB_0010de27:
  handle = pfVar3;
  pfStack_4b0 = (fdb_kvs_handle *)0x10de2e;
  reuse_on_delete_test();
LAB_0010de2e:
  pfStack_4b0 = (fdb_kvs_handle *)0x10de35;
  reuse_on_delete_test();
LAB_0010de35:
  pfStack_4b0 = (fdb_kvs_handle *)0x10de3c;
  reuse_on_delete_test();
  pfVar3 = handle;
LAB_0010de3c:
  pfStack_4b0 = (fdb_kvs_handle *)0x10de41;
  reuse_on_delete_test();
LAB_0010de41:
  handle = pfVar3;
  pfStack_4b0 = (fdb_kvs_handle *)0x10de48;
  reuse_on_delete_test();
LAB_0010de48:
  pfStack_4b0 = (fdb_kvs_handle *)0x10de4d;
  reuse_on_delete_test();
LAB_0010de4d:
  pfStack_4b0 = (fdb_kvs_handle *)0x10de52;
  reuse_on_delete_test();
LAB_0010de52:
  pfStack_4b0 = (fdb_kvs_handle *)0x10de59;
  reuse_on_delete_test();
LAB_0010de59:
  pfStack_4b0 = (fdb_kvs_handle *)fragmented_reuse_test;
  reuse_on_delete_test();
  pfStack_998 = (fdb_kvs_handle *)0x10de7d;
  fStack_6d0.bub_ctx.space_used = (uint64_t)pcVar9;
  fStack_6d0.bub_ctx.handle = pfVar6;
  pfStack_4c8 = handle;
  pcStack_4c0 = pcVar5;
  pcStack_4b8 = pcVar15;
  pfStack_4b0 = pfVar13;
  gettimeofday(&tStack_940,(__timezone_ptr_t)0x0);
  pfStack_998 = (fdb_kvs_handle *)0x10de82;
  memleak_start();
  pfStack_998 = (fdb_kvs_handle *)0x10de8f;
  fdb_get_default_kvs_config();
  pfStack_998 = (fdb_kvs_handle *)0x10de9f;
  fdb_get_default_config();
  fStack_6d0.config.block_reusing_threshold._7_1_ = 0;
  fStack_6d0.max_seqnum = 0x23;
  fStack_6d0.handle_busy.super___atomic_base<unsigned_char>._M_i = (__atomic_base<unsigned_char>)0xa
  ;
  fStack_6d0.dirty_updates = '\0';
  fStack_6d0._466_6_ = 0;
  pfStack_998 = (fdb_kvs_handle *)0x10dec6;
  system("rm -rf  staleblktest* > errorlog.txt");
  pfStack_998 = (fdb_kvs_handle *)0x10dedd;
  fdb_open(&pfStack_980,"./staleblktest1",(fdb_config *)&fStack_6d0.config.encryption_key);
  pfStack_998 = (fdb_kvs_handle *)0x10deed;
  fdb_kvs_open_default(pfStack_980,&pfStack_988,&fStack_930);
  pcVar9 = "%dkey";
  pcVar15 = (char *)&fStack_6d0;
  pcVar5 = auStack_918 + 0x48;
  pfVar13 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_998 = (fdb_kvs_handle *)0x10df15;
    sprintf(pcVar15,"%dkey",pfVar13);
    pfStack_998 = (fdb_kvs_handle *)0x10df27;
    memset(pcVar5,0x61,0x1ff);
    pfVar3 = pfStack_988;
    uStack_6d1 = 0;
    pfStack_998 = (fdb_kvs_handle *)0x10df3c;
    pfVar6 = (fdb_kvs_handle *)strlen(pcVar15);
    pfStack_998 = (fdb_kvs_handle *)0x10df47;
    sVar4 = strlen(pcVar5);
    pfStack_998 = (fdb_kvs_handle *)0x10df5b;
    fVar1 = fdb_set_kv(pfVar3,pcVar15,(size_t)pfVar6,pcVar5,sVar4);
    if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_0010e2c3:
      pfStack_998 = (fdb_kvs_handle *)0x10e2ca;
      fragmented_reuse_test();
      goto LAB_0010e2ca;
    }
    pfStack_998 = (fdb_kvs_handle *)0x10df72;
    fVar1 = fdb_commit(pfStack_980,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pfStack_998 = (fdb_kvs_handle *)0x10e2c3;
      fragmented_reuse_test();
      goto LAB_0010e2c3;
    }
    uVar10 = (int)pfVar13 + 1;
    pfVar13 = (fdb_kvs_handle *)(ulong)uVar10;
  } while (uVar10 != 0xb);
  pcVar5 = (char *)&fStack_6d0;
  pfVar3 = (fdb_kvs_handle *)(auStack_918 + 0x48);
  pfVar6 = (fdb_kvs_handle *)auStack_918;
  pcVar9 = (char *)0x0;
  do {
    uVar10 = (uint)pcVar9;
    pfStack_998 = (fdb_kvs_handle *)0x10dfab;
    sprintf(pcVar5,"%dkey",pcVar9);
    pfVar13 = pfStack_988;
    auStack_918._72_8_ = (filemgr *)0x6262626262626262;
    pdStack_8c8 = (docio_handle *)0x6262626262626262;
    pbStack_8c0 = (btreeblk_handle *)0x6262626262626262;
    pbStack_8b8 = (btree_blk_ops *)0x6262626262626262;
    pfStack_8b0 = (filemgr_ops *)0x6262626262626262;
    fStack_8a8.chunksize = 0x6262;
    fStack_8a8._2_2_ = 0x6262;
    fStack_8a8.blocksize = 0x62626262;
    fStack_8a8.buffercache_size = 0x6262626262626262;
    fStack_8a8.wal_threshold = 0x6262626262626262;
    fStack_8a8.wal_flush_before_commit = true;
    fStack_8a8.auto_commit = true;
    fStack_8a8._26_2_ = 0x6262;
    fStack_8a8.purging_interval = 0x62626262;
    fStack_8a8.seqtree_opt = 'b';
    fStack_8a8.durability_opt = 'b';
    fStack_8a8._34_2_ = 0x6262;
    fStack_8a8.flags = 0x62626262;
    fStack_8a8.compaction_buf_maxsize = 0x62626262;
    fStack_8a8.cleanup_cache_onclose = true;
    fStack_8a8.compress_document_body = true;
    fStack_8a8.compaction_mode = 'b';
    fStack_8a8.compaction_threshold = 'b';
    fStack_8a8.compaction_minimum_filesize = 0x6262626262626262;
    fStack_8a8.compactor_sleep_duration = 0x6262626262626262;
    fStack_8a8.multi_kv_instances = true;
    fStack_8a8._65_6_ = 0x626262626262;
    fStack_8a8._71_1_ = 0x62;
    fStack_8a8.prefetch_duration._0_7_ = 0x62626262626262;
    fStack_8a8._79_8_ = 0x6262626262626262;
    fStack_8a8._87_1_ = 0;
    pfStack_998 = (fdb_kvs_handle *)0x10e007;
    pcVar15 = (char *)strlen(pcVar5);
    pfStack_998 = (fdb_kvs_handle *)0x10e012;
    sVar4 = strlen((char *)pfVar3);
    pfStack_998 = (fdb_kvs_handle *)0x10e026;
    fVar1 = fdb_set_kv(pfVar13,pcVar5,(size_t)pcVar15,pfVar3,sVar4);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e2d1;
    pfStack_998 = (fdb_kvs_handle *)0x10e03b;
    fVar1 = fdb_get_file_info(pfStack_980,(fdb_file_info *)pfVar6);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e2ca;
    uVar11 = uVar10 + 1;
    pcVar9 = (char *)(ulong)uVar11;
  } while ((ulong)auStack_918._40_8_ < (fdb_file_handle *)0x1000000);
  uStack_974 = uVar10;
  if (2 < uVar10) {
    uVar10 = (uVar11 >> 2) + (uint)(uVar11 >> 2 == 0);
    pfVar6 = (fdb_kvs_handle *)(ulong)uVar10;
    pcVar15 = "%dkey";
    pcVar5 = (char *)&fStack_6d0;
    pfVar13 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_998 = (fdb_kvs_handle *)0x10e092;
      sprintf(pcVar5,"%dkey",pfVar13);
      pfVar3 = pfStack_988;
      pfStack_998 = (fdb_kvs_handle *)0x10e09f;
      sVar4 = strlen(pcVar5);
      pfStack_998 = (fdb_kvs_handle *)0x10e0ad;
      fVar1 = fdb_del_kv(pfVar3,pcVar5,sVar4);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e2df;
      uVar12 = (int)pfVar13 + 1;
      pfVar13 = (fdb_kvs_handle *)(ulong)uVar12;
    } while (uVar10 != uVar12);
  }
  pcVar5 = (char *)&fStack_6d0;
  pfStack_998 = (fdb_kvs_handle *)0x10e0c6;
  sVar2 = sb_check_block_reusing(pfStack_988);
  if (sVar2 == SBD_NONE) {
    pcVar5 = (char *)(pfStack_988->file->pos).super___atomic_base<unsigned_long>._M_i;
    pfStack_998 = (fdb_kvs_handle *)0x10e0ec;
    fVar1 = fdb_compact(pfStack_980,"staleblktest_compact");
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e2f9;
    pfStack_998 = (fdb_kvs_handle *)0x10e103;
    fVar1 = fdb_get_kvs_info(pfStack_988,&fStack_970);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e300;
    if (fStack_970.doc_count == 0) {
      pfStack_998 = (fdb_kvs_handle *)0x10e11d;
      fragmented_reuse_test();
    }
    pcVar15 = (char *)(ulong)(uVar11 >> 2);
    if (pcVar5 <= (fdb_kvs_handle *)(pfStack_988->file->pos).super___atomic_base<unsigned_long>._M_i
       ) {
      pfStack_998 = (fdb_kvs_handle *)0x10e143;
      fragmented_reuse_test();
    }
    uVar10 = uVar11 >> 1;
    pfVar13 = (fdb_kvs_handle *)(ulong)uVar10;
    if (uVar11 >> 2 < uVar10) {
      pcVar5 = "%dkey";
      pfVar3 = &fStack_6d0;
      do {
        pfStack_998 = (fdb_kvs_handle *)0x10e16b;
        sprintf((char *)pfVar3,"%dkey",pcVar15);
        pfVar6 = pfStack_988;
        pfStack_998 = (fdb_kvs_handle *)0x10e178;
        sVar4 = strlen((char *)pfVar3);
        pfStack_998 = (fdb_kvs_handle *)0x10e186;
        fVar1 = fdb_del_kv(pfVar6,pfVar3,sVar4);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e2e6;
        uVar12 = (int)pcVar15 + 1;
        pcVar15 = (char *)(ulong)uVar12;
      } while (uVar12 < uVar10);
    }
    pfStack_998 = (fdb_kvs_handle *)0x10e1a0;
    sVar2 = sb_check_block_reusing(pfStack_988);
    if (sVar2 != SBD_NONE) goto LAB_0010e307;
    if (uVar10 <= uStack_974) {
      pcVar15 = "%dkey";
      pcVar5 = (char *)&fStack_6d0;
      do {
        pfStack_998 = (fdb_kvs_handle *)0x10e1cc;
        sprintf(pcVar5,"%dkey",pfVar13);
        pfVar3 = pfStack_988;
        pfStack_998 = (fdb_kvs_handle *)0x10e1d9;
        sVar4 = strlen(pcVar5);
        pfStack_998 = (fdb_kvs_handle *)0x10e1e7;
        fVar1 = fdb_del_kv(pfVar3,pcVar5,sVar4);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e2ed;
        uVar10 = (int)pfVar13 + 1;
        pfVar13 = (fdb_kvs_handle *)(ulong)uVar10;
      } while (uVar11 != uVar10);
    }
    pcVar9 = (char *)0xb;
    do {
      pfStack_998 = (fdb_kvs_handle *)0x10e209;
      fVar1 = fdb_commit(pfStack_980,'\x01');
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e2d8;
      uVar10 = (int)pcVar9 - 1;
      pcVar9 = (char *)(ulong)uVar10;
    } while (uVar10 != 0);
    pfStack_998 = (fdb_kvs_handle *)0x10e224;
    fVar1 = fdb_get_kvs_info(pfStack_988,&fStack_970);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e30c;
    pfStack_998 = (fdb_kvs_handle *)0x10e236;
    sVar2 = sb_check_block_reusing(pfStack_988);
    if (sVar2 == SBD_NONE) goto LAB_0010e313;
    pfStack_998 = (fdb_kvs_handle *)0x10e24d;
    fVar1 = fdb_commit(pfStack_980,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e318;
    pfStack_998 = (fdb_kvs_handle *)0x10e25f;
    fVar1 = fdb_close(pfStack_980);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e31f;
    pfStack_998 = (fdb_kvs_handle *)0x10e26c;
    fVar1 = fdb_shutdown();
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStack_998 = (fdb_kvs_handle *)0x10e279;
      memleak_end();
      pcVar15 = "%s PASSED\n";
      if (fragmented_reuse_test()::__test_pass != '\0') {
        pcVar15 = "%s FAILED\n";
      }
      pfStack_998 = (fdb_kvs_handle *)0x10e2aa;
      fprintf(_stderr,pcVar15,"fragmented reuse test");
      return;
    }
  }
  else {
LAB_0010e2f4:
    pfStack_998 = (fdb_kvs_handle *)0x10e2f9;
    fragmented_reuse_test();
LAB_0010e2f9:
    pfStack_998 = (fdb_kvs_handle *)0x10e300;
    fragmented_reuse_test();
LAB_0010e300:
    pfStack_998 = (fdb_kvs_handle *)0x10e307;
    fragmented_reuse_test();
LAB_0010e307:
    pfStack_998 = (fdb_kvs_handle *)0x10e30c;
    fragmented_reuse_test();
LAB_0010e30c:
    pfStack_998 = (fdb_kvs_handle *)0x10e313;
    fragmented_reuse_test();
LAB_0010e313:
    pfStack_998 = (fdb_kvs_handle *)0x10e318;
    fragmented_reuse_test();
LAB_0010e318:
    pfStack_998 = (fdb_kvs_handle *)0x10e31f;
    fragmented_reuse_test();
LAB_0010e31f:
    pfStack_998 = (fdb_kvs_handle *)0x10e326;
    fragmented_reuse_test();
  }
  pfStack_998 = (fdb_kvs_handle *)enter_reuse_via_separate_kvs_test;
  fragmented_reuse_test();
  pcStackY_e60 = (code *)0x10e34a;
  pcStack_9c0 = pcVar9;
  pfStack_9b8 = pfVar3;
  pfStack_9b0 = pfVar6;
  pfStack_9a8 = (fdb_kvs_handle *)pcVar15;
  pfStack_9a0 = (fdb_kvs_handle *)pcVar5;
  pfStack_998 = pfVar13;
  gettimeofday(&tStack_e28,(__timezone_ptr_t)0x0);
  pcStackY_e60 = (code *)0x10e34f;
  memleak_start();
  pfStack_e38 = (fdb_doc *)0x0;
  pcStackY_e60 = (code *)0x10e368;
  fdb_get_default_kvs_config();
  pcStackY_e60 = (code *)0x10e378;
  fdb_get_default_config();
  fStack_ab8.compaction_threshold = '\0';
  fStack_ab8.block_reusing_threshold = 0x23;
  fStack_ab8.num_keeping_headers = 10;
  pcStackY_e60 = (code *)0x10e39f;
  system("rm -rf  staleblktest* > errorlog.txt");
  pcStackY_e60 = (code *)0x10e3b6;
  fdb_open(&pfStack_e48,"./staleblktest1",&fStack_ab8);
  pcStackY_e60 = (code *)0x10e3cd;
  fdb_kvs_open(pfStack_e48,&pfStack_e50,"db",&fStack_c18);
  pcStackY_e60 = (code *)0x10e3e4;
  fdb_kvs_open(pfStack_e48,&pfStack_e30,"db2",&fStack_c18);
  pcVar15 = acStack_bb8;
  doc = (fdb_doc **)0x6161616161616161;
  pcVar5 = acStack_e18;
  pcVar9 = (char *)0x0;
  do {
    pcStackY_e60 = (code *)0x10e410;
    sprintf(pcVar15,"%dkey",pcVar9);
    pfVar13 = pfStack_e50;
    builtin_strncpy(acStack_e18,"aaaaaaaaaaa",0xc);
    pcStackY_e60 = (code *)0x10e42f;
    sVar7 = strlen(pcVar15);
    pcStackY_e60 = (code *)0x10e43a;
    sVar4 = strlen(pcVar5);
    pcStackY_e60 = (code *)0x10e44e;
    fVar1 = fdb_set_kv(pfVar13,pcVar15,sVar7,pcVar5,sVar4);
    pfVar13 = pfStack_e30;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcStackY_e60 = (code *)0x10e759;
      enter_reuse_via_separate_kvs_test();
LAB_0010e759:
      pcStackY_e60 = (code *)0x10e760;
      enter_reuse_via_separate_kvs_test();
LAB_0010e760:
      pcStackY_e60 = (code *)0x10e767;
      enter_reuse_via_separate_kvs_test();
      goto LAB_0010e767;
    }
    pcStackY_e60 = (code *)0x10e463;
    sVar7 = strlen(pcVar15);
    pcStackY_e60 = (code *)0x10e46e;
    sVar4 = strlen(pcVar5);
    pcStackY_e60 = (code *)0x10e482;
    fVar1 = fdb_set_kv(pfVar13,pcVar15,sVar7,pcVar5,sVar4);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e759;
    pcStackY_e60 = (code *)0x10e499;
    fVar1 = fdb_commit(pfStack_e48,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e760;
    uVar10 = (int)pcVar9 + 1;
    pcVar9 = (char *)(ulong)uVar10;
  } while (uVar10 != 10);
  pcVar5 = (char *)0x0;
  pcVar9 = acStack_bb8;
  pcVar15 = acStack_e18;
  doc = (fdb_doc **)0x0;
  do {
    pfVar13 = pfStack_e50;
    builtin_strncpy(acStack_bb8,"0key",5);
    builtin_strncpy(acStack_e18,
                    "bbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbb"
                    ,0x80);
    pcStackY_e60 = (code *)0x10e521;
    sVar7 = strlen(pcVar9);
    pcStackY_e60 = (code *)0x10e52c;
    sVar4 = strlen(pcVar15);
    pcStackY_e60 = (code *)0x10e540;
    fVar1 = fdb_set_kv(pfVar13,pcVar9,sVar7,pcVar15,sVar4);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e76e;
    pcStackY_e60 = (code *)0x10e55a;
    fVar1 = fdb_get_file_info(pfStack_e48,&fStack_c00);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e767;
    uVar10 = (int)doc + 1;
    doc = (fdb_doc **)(ulong)uVar10;
  } while (fStack_c00.file_size < 0x1000000);
  pcStackY_e60 = (code *)0x10e580;
  sVar2 = sb_check_block_reusing(pfStack_e50);
  if (sVar2 == SBD_RECLAIM) {
    pcStackY_e60 = (code *)0x10e598;
    fVar1 = fdb_commit(pfStack_e48,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e786;
    pcVar15 = acStack_bb8;
    pcVar5 = acStack_e18;
    pcVar9 = (char *)0x0;
    do {
      pcStackY_e60 = (code *)0x10e5c2;
      sprintf(pcVar15,"key%d",pcVar9);
      pfVar13 = pfStack_e50;
      builtin_strncpy(acStack_e18,
                      "ccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccc"
                      ,0x80);
      pcStackY_e60 = (code *)0x10e612;
      sVar7 = strlen(pcVar15);
      pcStackY_e60 = (code *)0x10e61d;
      sVar4 = strlen(pcVar5);
      pcStackY_e60 = (code *)0x10e631;
      fVar1 = fdb_set_kv(pfVar13,pcVar15,sVar7,pcVar5,sVar4);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e775;
      uVar11 = (int)pcVar9 + 1;
      pcVar9 = (char *)(ulong)uVar11;
    } while (uVar10 != uVar11);
    pcStackY_e60 = (code *)0x10e652;
    fVar1 = fdb_commit(pfStack_e48,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e78d;
    pcStackY_e60 = (code *)0x10e67a;
    fdb_iterator_init(pfStack_e30,&pfStack_e40,(void *)0x0,0,(void *)0x0,0,0);
    pcVar9 = (char *)0xa;
    doc = &pfStack_e38;
    do {
      pcStackY_e60 = (code *)0x10e691;
      fVar1 = fdb_iterator_get(pfStack_e40,doc);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e77c;
      pcStackY_e60 = (code *)0x10e6a3;
      fdb_doc_free(pfStack_e38);
      pfStack_e38 = (fdb_doc *)0x0;
      pcStackY_e60 = (code *)0x10e6b6;
      fVar1 = fdb_iterator_next(pfStack_e40);
      uVar10 = (int)pcVar9 - 1;
      pcVar9 = (char *)(ulong)uVar10;
    } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
    if (uVar10 != 0) goto LAB_0010e794;
    pcStackY_e60 = (code *)0x10e6cf;
    fdb_iterator_close(pfStack_e40);
    pcStackY_e60 = (code *)0x10e6d9;
    fVar1 = fdb_kvs_close(pfStack_e50);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e799;
    pcStackY_e60 = (code *)0x10e6eb;
    fVar1 = fdb_kvs_close(pfStack_e30);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcStackY_e60 = (code *)0x10e6fd;
      fVar1 = fdb_close(pfStack_e48);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        pcStackY_e60 = (code *)0x10e70a;
        fdb_shutdown();
        pcStackY_e60 = (code *)0x10e70f;
        memleak_end();
        pcVar15 = "%s PASSED\n";
        if (enter_reuse_via_separate_kvs_test()::__test_pass != '\0') {
          pcVar15 = "%s FAILED\n";
        }
        pcStackY_e60 = (code *)0x10e740;
        fprintf(_stderr,pcVar15,"enter reuse via separate kvs test");
        return;
      }
      goto LAB_0010e7a7;
    }
  }
  else {
LAB_0010e781:
    pcStackY_e60 = (code *)0x10e786;
    enter_reuse_via_separate_kvs_test();
LAB_0010e786:
    pcStackY_e60 = (code *)0x10e78d;
    enter_reuse_via_separate_kvs_test();
LAB_0010e78d:
    pcStackY_e60 = (code *)0x10e794;
    enter_reuse_via_separate_kvs_test();
LAB_0010e794:
    pcStackY_e60 = (code *)0x10e799;
    enter_reuse_via_separate_kvs_test();
LAB_0010e799:
    pcStackY_e60 = (code *)0x10e7a0;
    enter_reuse_via_separate_kvs_test();
  }
  pcStackY_e60 = (code *)0x10e7a7;
  enter_reuse_via_separate_kvs_test();
LAB_0010e7a7:
  pcStackY_e60 = child_function;
  enter_reuse_via_separate_kvs_test();
  ppfStackY_e88 = doc;
  sStackY_e78 = sVar7;
  pcStackY_e70 = pcVar15;
  pcStackY_e68 = pcVar5;
  pcStackY_e60 = (code *)pcVar9;
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  fStackY_1188.block_reusing_threshold = 0x41;
  fStackY_1188.num_keeping_headers = 5;
  fdb_open(&pfStackY_12b0,"./staleblktest1",&fStackY_1188);
  fdb_kvs_open(pfStackY_12b0,&pfStackY_12b8,"db",&fStackY_12a8);
  iVar8 = 0;
  uVar14 = 0;
  do {
    sprintf(acStackY_1290,"key%d",uVar14);
    sprintf(acStackY_1090,"seqno%d",uVar14);
    pfVar13 = pfStackY_12b8;
    sVar4 = strlen(acStackY_1290);
    sVar7 = strlen(acStackY_1090);
    fdb_set_kv(pfVar13,acStackY_1290,sVar4,acStackY_1090,sVar7);
    if ((int)(uVar14 / 100) * 100 + iVar8 == 0) {
      fdb_commit(pfStackY_12b0,(int)(uVar14 / 500) * 500 + iVar8 == 0);
    }
    uVar14 = (ulong)((int)uVar14 + 1);
    iVar8 = iVar8 + -1;
  } while( true );
LAB_0010e2ca:
  pfStack_998 = (fdb_kvs_handle *)0x10e2d1;
  fragmented_reuse_test();
LAB_0010e2d1:
  pfStack_998 = (fdb_kvs_handle *)0x10e2d8;
  fragmented_reuse_test();
LAB_0010e2d8:
  pfStack_998 = (fdb_kvs_handle *)0x10e2df;
  fragmented_reuse_test();
LAB_0010e2df:
  pfStack_998 = (fdb_kvs_handle *)0x10e2e6;
  fragmented_reuse_test();
LAB_0010e2e6:
  pfStack_998 = (fdb_kvs_handle *)0x10e2ed;
  fragmented_reuse_test();
LAB_0010e2ed:
  pfStack_998 = (fdb_kvs_handle *)0x10e2f4;
  fragmented_reuse_test();
  goto LAB_0010e2f4;
LAB_0010e767:
  pcStackY_e60 = (code *)0x10e76e;
  enter_reuse_via_separate_kvs_test();
LAB_0010e76e:
  pcStackY_e60 = (code *)0x10e775;
  enter_reuse_via_separate_kvs_test();
LAB_0010e775:
  pcStackY_e60 = (code *)0x10e77c;
  enter_reuse_via_separate_kvs_test();
LAB_0010e77c:
  pcStackY_e60 = (code *)0x10e781;
  enter_reuse_via_separate_kvs_test();
  goto LAB_0010e781;
}

Assistant:

void reuse_on_delete_test() {
    TEST_INIT();
    memleak_start();

    int i, r, ndocs;
    int nheaders = 10;
    char keybuf[256];
    char bodybuf[512];

    fdb_status status;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    sb_decision_t sb_decision;
    fdb_file_info file_info;

    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_config fconfig = fdb_get_default_config();
    fconfig.compaction_threshold = 0;
    fconfig.block_reusing_threshold = 65;
    fconfig.num_keeping_headers = nheaders;

    // remove previous staleblktest files
    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    fdb_open(&dbfile, "./staleblktest1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);

    // create num_keeping_headers+1
    for (i = 0; i < nheaders + 1; i++) {
        sprintf(keybuf, "%dkey",i);
        fillstr(bodybuf, 'b', 512);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // load until exceeding SB_MIN_BLOCK_REUSING_FILESIZE
    i = 0;
    do {
        sprintf(keybuf, "%dkey",i);
        fillstr(bodybuf, 'c', 128);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        i++;
        status = fdb_get_file_info(dbfile, &file_info);
        TEST_STATUS(status);
    } while (file_info.file_size < SB_MIN_BLOCK_REUSING_FILESIZE);
    ndocs = i;

    // expect NO REUSE
    sb_decision = sb_check_block_reusing(db);
    TEST_CHK(sb_decision == SBD_NONE);
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // delete so that file becomes stale
    for (i = 0; i < ndocs; ++i) {
        sprintf(keybuf, "%dkey",i);
        status = fdb_del_kv(db, keybuf, strlen(keybuf));
        TEST_STATUS(status);
    }

    sb_decision = sb_check_block_reusing(db);
    TEST_CHK(sb_decision == SBD_RECLAIM);

    // reload 1/4 all keys again and expect no file size growth
    // since all docs being reused
    for (i = 0; i < ndocs / 4; ++i) {
        sprintf(keybuf, "%dkey",i);
        fillstr(bodybuf, 'd', 128);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        i++;
    }

    // expect to still be in reuse mode
    sb_decision = sb_check_block_reusing(db);
    TEST_CHK(sb_decision == SBD_RECLAIM);

    status = fdb_close(dbfile);
    TEST_STATUS(status);
    status = fdb_shutdown();
    TEST_STATUS(status);

    memleak_end();
    TEST_RESULT("reuse on delete test");
}